

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_scanline_chunk_info(exr_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  _internal_exr_part *p_Var1;
  anon_struct_8_2_947311e6_for_anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0_0 aVar2;
  anon_struct_8_2_947311e6_for_anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0_0 aVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint *in_RCX;
  uint in_EDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_chunk_info_t nil;
  int cidx;
  int miny;
  int lpc;
  exr_attr_box2i_t dw;
  undefined1 local_80 [16];
  _internal_exr_part *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint local_3c;
  uint local_30;
  uint uStack_2c;
  int local_28;
  uint uStack_24;
  exr_result_t local_4;
  
  memset(local_80,0,0x40);
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (in_RCX == (uint *)0x0) {
        internal_exr_unlock(in_RDI);
        local_4 = (*in_RDI->standard_error)(in_RDI,3);
      }
      else if ((p_Var1->storage_mode == EXR_STORAGE_TILED) ||
              (p_Var1->storage_mode == EXR_STORAGE_DEEP_TILED)) {
        internal_exr_unlock(in_RDI);
        local_4 = (*in_RDI->standard_error)(in_RDI,0x12);
      }
      else if (in_RDI->mode == '\x03') {
        aVar2 = (p_Var1->data_window).min.field_0.field_0;
        aVar3 = (p_Var1->data_window).max.field_0.field_0;
        uStack_2c = aVar2.y;
        uStack_24 = aVar3.y;
        if (((int)in_EDX < (int)uStack_2c) || ((int)uStack_24 < (int)in_EDX)) {
          internal_exr_unlock(in_RDI);
          local_4 = (*in_RDI->print_error)
                              (in_RDI,3,
                               "Invalid request for scanline %d outside range of data window (%d - %d)"
                               ,(ulong)in_EDX,(ulong)uStack_2c,(ulong)uStack_24);
        }
        else {
          uVar4 = (uint)p_Var1->lines_per_chunk;
          local_3c = in_EDX - uStack_2c;
          if (1 < (int)uVar4) {
            local_3c = (int)local_3c / (int)uVar4;
          }
          uVar5 = local_3c * uVar4 + uStack_2c;
          if (((int)local_3c < 0) || (p_Var1->chunk_count <= (int)local_3c)) {
            internal_exr_unlock(in_RDI);
            local_4 = (*in_RDI->print_error)
                                (in_RDI,3,
                                 "Invalid request for scanline %d in chunk %d outside chunk count %d"
                                 ,(ulong)in_EDX,(ulong)local_3c,(ulong)(uint)p_Var1->chunk_count);
          }
          else {
            memcpy(in_RCX,local_80,0x40);
            *in_RCX = local_3c;
            *(char *)((long)in_RCX + 0x16) = (char)p_Var1->storage_mode;
            *(char *)((long)in_RCX + 0x17) = (char)p_Var1->comp_type;
            local_30 = aVar2.x;
            in_RCX[1] = local_30;
            in_RCX[2] = uVar5;
            local_28 = aVar3.x;
            in_RCX[4] = (local_28 - local_30) + 1;
            in_RCX[3] = uVar4;
            if ((int)uVar5 < (int)uStack_2c) {
              in_RCX[2] = uStack_2c;
              in_RCX[3] = in_RCX[3] - (uStack_2c - uVar5);
            }
            else if ((int)uStack_24 < (int)(uVar5 + uVar4)) {
              in_RCX[3] = (uStack_24 - uVar5) + 1;
            }
            *(undefined1 *)(in_RCX + 5) = 0;
            *(undefined1 *)((long)in_RCX + 0x15) = 0;
            in_RCX[0xc] = 0;
            in_RCX[0xd] = 0;
            in_RCX[0xe] = 0;
            in_RCX[0xf] = 0;
            in_RCX[6] = 0;
            in_RCX[7] = 0;
            in_RCX[8] = 0;
            in_RCX[9] = 0;
            uVar6 = compute_chunk_unpack_size
                              (in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                               in_stack_ffffffffffffff90);
            *(uint64_t *)(in_RCX + 10) = uVar6;
            internal_exr_unlock(in_RDI);
            local_4 = 0;
          }
        }
      }
      else if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
        local_4 = (*in_RDI->standard_error)(in_RDI,9);
      }
      else {
        internal_exr_unlock(in_RDI);
        local_4 = (*in_RDI->standard_error)(in_RDI,8);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_write_scanline_chunk_info (
    exr_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_attr_box2i_t dw;
    int              lpc, miny, cidx;
    exr_chunk_info_t nil = {0};

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!cinfo)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_SCAN_TILE_MIXEDAPI));
    }

    if (pctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (pctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (
                pctxt->standard_error (pctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y));
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - dw.min.y);
    if (lpc > 1) cidx /= lpc;

    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = cidx * lpc + dw.min.y;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count));
    }

    *cinfo             = nil;
    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= (dw.min.y - miny);
    }
    else if ((miny + lpc) > dw.max.y) { cinfo->height = (dw.max.y - miny + 1); }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    cinfo->sample_count_data_offset = 0;
    cinfo->sample_count_table_size  = 0;
    cinfo->data_offset              = 0;
    cinfo->packed_size              = 0;
    cinfo->unpacked_size =
        compute_chunk_unpack_size (y, cinfo->width, cinfo->height, lpc, part);

    return EXR_UNLOCK_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}